

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTasks.cpp
# Opt level: O1

Type * __thiscall
slang::ast::builtins::SReadMemTask::checkArguments
          (SReadMemTask *this,ASTContext *context,Args *args,SourceRange range,Expression *param_4)

{
  Compilation *pCVar1;
  ulong uVar2;
  bool bVar3;
  bool bVar4;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  undefined7 extraout_var_01;
  Type *pTVar5;
  Expression *arg;
  ulong uVar6;
  
  pCVar1 = ((context->scope).ptr)->compilation;
  bVar3 = SystemSubroutine::checkArgCount
                    ((SystemSubroutine *)this,context,false,args,range,4,0x7fffffff);
  if (!bVar3) {
    return pCVar1->errorType;
  }
  bVar3 = Type::isUnpackedArray(((*args->_M_ptr)->type).ptr);
  arg = args->_M_ptr[1];
  if (bVar3) {
    bVar3 = Type::isNumeric((arg->type).ptr);
    if (bVar3) {
      bVar3 = Type::isNumeric((args->_M_ptr[2]->type).ptr);
      pTVar5 = (Type *)CONCAT71(extraout_var,bVar3);
      if (bVar3) {
        bVar3 = 3 < (args->_M_extent)._M_extent_value;
        if (bVar3) {
          bVar4 = Type::canBeStringLike((args->_M_ptr[3]->type).ptr);
          pTVar5 = (Type *)CONCAT71(extraout_var_00,bVar4);
          uVar6 = 3;
          if (bVar4) {
            uVar2 = 4;
            do {
              uVar6 = uVar2;
              bVar3 = uVar6 < (args->_M_extent)._M_extent_value;
              if (!bVar3) goto LAB_0041b916;
              bVar4 = Type::canBeStringLike((args->_M_ptr[uVar6]->type).ptr);
              pTVar5 = (Type *)CONCAT71(extraout_var_01,bVar4);
              uVar2 = uVar6 + 1;
            } while (bVar4);
          }
          pTVar5 = SystemSubroutine::badArg((SystemSubroutine *)this,context,args->_M_ptr[uVar6]);
        }
LAB_0041b916:
        if (bVar3) {
          return pTVar5;
        }
        return pCVar1->voidType;
      }
      arg = args->_M_ptr[2];
    }
    else {
      arg = args->_M_ptr[1];
    }
  }
  pTVar5 = SystemSubroutine::badArg((SystemSubroutine *)this,context,arg);
  return pTVar5;
}

Assistant:

const Type& checkArguments(const ASTContext& context, const Args& args, SourceRange range,
                               const Expression*) const final {
        auto& comp = context.getCompilation();
        if (!checkArgCount(context, false, args, range, 4, INT32_MAX))
            return comp.getErrorType();

        if (!args[0]->type->isUnpackedArray())
            return badArg(context, *args[1]);

        if (!args[1]->type->isNumeric())
            return badArg(context, *args[1]);

        if (!args[2]->type->isNumeric())
            return badArg(context, *args[2]);

        for (size_t i = 3; i < args.size(); i++) {
            if (!args[i]->type->canBeStringLike())
                return badArg(context, *args[i]);
        }

        return comp.getVoidType();
    }